

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

int __thiscall
Centaurus::CATNMachine<wchar_t>::import_whitespace
          (CATNMachine<wchar_t> *this,CharClass<wchar_t> *cc,int origin,int tag)

{
  reference this_00;
  CharClass<wchar_t> local_40;
  int local_20;
  int local_1c;
  int tag_local;
  int origin_local;
  CharClass<wchar_t> *cc_local;
  CATNMachine<wchar_t> *this_local;
  
  local_20 = tag;
  local_1c = origin;
  _tag_local = cc;
  cc_local = (CharClass<wchar_t> *)this;
  CharClass<wchar_t>::CharClass(&local_40);
  local_1c = add_node(this,&local_40,local_1c,local_20);
  CharClass<wchar_t>::~CharClass(&local_40);
  this_00 = std::
            vector<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>::
            operator[](&this->m_nodes,(long)local_1c);
  CATNNode<wchar_t>::add_transition(this_00,_tag_local,local_1c,0);
  return local_1c;
}

Assistant:

int import_whitespace(const CharClass<TCHAR>& cc, int origin, int tag)
    {
        origin = add_node(CharClass<TCHAR>(), origin, tag);
        m_nodes[origin].add_transition(cc, origin);
        return origin;
    }